

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

void __thiscall
cppcms::impl::
handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
::handler_binder_p1(handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
                    *this,offset_in_connection_to_subr *f,
                   shared_ptr<cppcms::impl::cgi::connection> *s,callback<void_()> *p1)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffffb8;
  callable<void_()> *in_stack_ffffffffffffffc0;
  shared_ptr<cppcms::impl::cgi::connection> *this_00;
  
  booster::callable<void_()>::callable(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__handler_binder_p1_0052acc0;
  uVar1 = *in_RSI;
  in_RDI[3] = in_RSI[1];
  in_RDI[2] = uVar1;
  this_00 = (shared_ptr<cppcms::impl::cgi::connection> *)(in_RDI + 4);
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr(this_00,in_stack_ffffffffffffffb8);
  booster::callback<void_()>::callback
            ((callback<void_()> *)this_00,(callback<void_()> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

handler_binder_p1(F const &f,S const &s, P1 const &p1) : f_(f), s_(s), p1_(p1) {}